

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_callTMres(lua_State *L,TValue *f,TValue *p1,TValue *p2,StkId res)

{
  long lVar1;
  Value *pVVar2;
  StkId pSVar3;
  TValue *io2_3;
  TValue *io1_3;
  TValue *io2_2;
  TValue *io1_2;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  StkId func;
  ptrdiff_t result;
  StkId res_local;
  TValue *p2_local;
  TValue *p1_local;
  TValue *f_local;
  lua_State *L_local;
  
  lVar1 = (L->stack).offset;
  pSVar3 = (L->top).p;
  (pSVar3->val).value_ = f->value_;
  (pSVar3->val).tt_ = f->tt_;
  pSVar3[1].val.value_ = p1->value_;
  *(lu_byte *)((long)pSVar3 + 0x18) = p1->tt_;
  pSVar3[2].val.value_ = p2->value_;
  *(lu_byte *)((long)pSVar3 + 0x28) = p2->tt_;
  (L->top).p = (StkId)((L->top).offset + 0x30);
  if ((L->ci->callstatus & 10) == 0) {
    luaD_call(L,pSVar3,1);
  }
  else {
    luaD_callnoyield(L,pSVar3,1);
  }
  pVVar2 = (Value *)((long)(L->stack).p + ((long)res - lVar1));
  lVar1 = (L->top).offset;
  pSVar3 = (StkId)(lVar1 + -0x10);
  (L->top).p = pSVar3;
  *pVVar2 = (pSVar3->val).value_;
  pVVar2[1].ub = *(lu_byte *)(lVar1 + -8);
  return;
}

Assistant:

void luaT_callTMres (lua_State *L, const TValue *f, const TValue *p1,
                     const TValue *p2, StkId res) {
  ptrdiff_t result = savestack(L, res);
  StkId func = L->top.p;
  setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
  setobj2s(L, func + 1, p1);  /* 1st argument */
  setobj2s(L, func + 2, p2);  /* 2nd argument */
  L->top.p += 3;
  /* metamethod may yield only when called from Lua code */
  if (isLuacode(L->ci))
    luaD_call(L, func, 1);
  else
    luaD_callnoyield(L, func, 1);
  res = restorestack(L, result);
  setobjs2s(L, res, --L->top.p);  /* move result to its place */
}